

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::buildGeneralCallInstruction(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  CallNode *node;
  NodeSequence NVar2;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
  if (pFVar1 == (Function *)0x0) {
    node = createNode<(NodeType)7,decltype(nullptr),llvm::CallInst_const*>
                     ((void *)0x0,callInstruction);
  }
  else {
    node = createNode<(NodeType)7,llvm::CallInst_const*>(callInstruction);
  }
  NVar2.first = &addNode<CallNode>(this,node)->super_Node;
  NVar2.second = NVar2.first;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::buildGeneralCallInstruction(const CallInst *callInstruction) {
    CallNode *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = addNode(createNode<NodeType::CALL>(callInstruction));
    } else {
        callNode =
                addNode(createNode<NodeType::CALL>(nullptr, callInstruction));
    }
    return {callNode, callNode};
}